

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmi2mid.cc
# Opt level: O3

PBuffer __thiscall ConvertorXMI2MID::create_track(ConvertorXMI2MID *this,MidiNodes *nodes)

{
  byte value;
  uchar value_00;
  uchar value_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  MutableBuffer *this_01;
  element_type *this_02;
  ulong uVar1;
  long lVar2;
  uint uVar3;
  long *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  int iVar5;
  long lVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_03;
  __normal_iterator<ConvertorXMI2MID::MidiNode_*,_std::vector<ConvertorXMI2MID::MidiNode,_std::allocator<ConvertorXMI2MID::MidiNode>_>_>
  __i;
  long lVar7;
  bool bVar8;
  PBuffer PVar9;
  undefined1 local_81;
  long *local_80;
  MutableBuffer *local_78;
  element_type *peStack_70;
  long local_60;
  PBuffer local_58;
  element_type *local_48;
  element_type *local_40;
  EndianessMode local_34;
  
  lVar2 = *in_RDX;
  lVar6 = in_RDX[1];
  local_80 = in_RDX;
  local_48 = (element_type *)this;
  if (lVar2 != lVar6) {
    uVar1 = lVar6 - lVar2 >> 5;
    lVar7 = 0x3f;
    if (uVar1 != 0) {
      for (; uVar1 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<ConvertorXMI2MID::MidiNode*,std::vector<ConvertorXMI2MID::MidiNode,std::allocator<ConvertorXMI2MID::MidiNode>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<ConvertorXMI2MID::create_track(std::vector<ConvertorXMI2MID::MidiNode,std::allocator<ConvertorXMI2MID::MidiNode>>*)::CompareByTime>>
              (lVar2,lVar6,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar6 - lVar2 < 0x201) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<ConvertorXMI2MID::MidiNode*,std::vector<ConvertorXMI2MID::MidiNode,std::allocator<ConvertorXMI2MID::MidiNode>>>,__gnu_cxx::__ops::_Iter_comp_iter<ConvertorXMI2MID::create_track(std::vector<ConvertorXMI2MID::MidiNode,std::allocator<ConvertorXMI2MID::MidiNode>>*)::CompareByTime>>
                (lVar2,lVar6);
    }
    else {
      lVar7 = lVar2 + 0x200;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<ConvertorXMI2MID::MidiNode*,std::vector<ConvertorXMI2MID::MidiNode,std::allocator<ConvertorXMI2MID::MidiNode>>>,__gnu_cxx::__ops::_Iter_comp_iter<ConvertorXMI2MID::create_track(std::vector<ConvertorXMI2MID::MidiNode,std::allocator<ConvertorXMI2MID::MidiNode>>*)::CompareByTime>>
                (lVar2,lVar7);
      for (; lVar7 != lVar6; lVar7 = lVar7 + 0x20) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<ConvertorXMI2MID::MidiNode*,std::vector<ConvertorXMI2MID::MidiNode,std::allocator<ConvertorXMI2MID::MidiNode>>>,__gnu_cxx::__ops::_Val_comp_iter<ConvertorXMI2MID::create_track(std::vector<ConvertorXMI2MID::MidiNode,std::allocator<ConvertorXMI2MID::MidiNode>>*)::CompareByTime>>
                  (lVar7);
      }
    }
  }
  local_34 = EndianessBig;
  std::__shared_ptr<MutableBuffer,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<MutableBuffer>,Buffer::EndianessMode>
            ((__shared_ptr<MutableBuffer,(__gnu_cxx::_Lock_policy)2> *)&local_78,
             (allocator<MutableBuffer> *)&local_81,&local_34);
  lVar2 = local_80[1];
  _Var4._M_pi = extraout_RDX;
  if (*local_80 != lVar2) {
    lVar6 = 0;
    do {
      local_60 = *(long *)(lVar2 + -0x20);
      value = *(byte *)(lVar2 + -0x14);
      value_00 = *(uchar *)(lVar2 + -0x13);
      value_01 = *(uchar *)(lVar2 + -0x12);
      local_40 = *(element_type **)(lVar2 + -0x10);
      this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar2 + -8);
      if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_80[1] = lVar2 + -0x20;
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
          this_03 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_80[1] + -8);
          local_80[1] = local_80[1] + -0x20;
          if (this_03 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00139d49;
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
          local_80[1] = lVar2 + -0x20;
          this_03 = this_00;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_03);
      }
LAB_00139d49:
      this_02 = peStack_70;
      this_01 = local_78;
      if (peStack_70 != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&(peStack_70->super_enable_shared_from_this<Buffer>)._M_weak_this.
                   super___weak_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(int *)&(peStack_70->super_enable_shared_from_this<Buffer>)._M_weak_this.
                        super___weak_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
          UNLOCK();
        }
        else {
          *(int *)&(peStack_70->super_enable_shared_from_this<Buffer>)._M_weak_this.
                   super___weak_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(int *)&(peStack_70->super_enable_shared_from_this<Buffer>)._M_weak_this.
                        super___weak_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
        }
      }
      uVar1 = local_60 - lVar6;
      uVar3 = (uint)uVar1 & 0x7f;
      iVar5 = 1;
      if (0x7f < uVar1) {
        do {
          uVar3 = (uint)(uVar1 >> 7) & 0xff | uVar3 << 8 | 0x80;
          iVar5 = iVar5 + 1;
          bVar8 = 0x3fff < uVar1;
          uVar1 = uVar1 >> 7;
        } while (bVar8);
      }
      do {
        MutableBuffer::push<unsigned_char>(this_01,(uchar)uVar3,1);
        uVar3 = uVar3 >> 8;
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
      if (this_02 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02);
      }
      MutableBuffer::push<unsigned_char>(local_78,value,1);
      MutableBuffer::push<unsigned_char>(local_78,value_00,1);
      _Var4._M_pi = extraout_RDX_00;
      if (((value & 0xf0 | 0x10) != 0xd0) &&
         (MutableBuffer::push<unsigned_char>(local_78,value_01,1), _Var4._M_pi = extraout_RDX_02,
         value_01 != '\0' && value == 0xff)) {
        local_58.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_40;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        local_58.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_00;
        MutableBuffer::push(local_78,&local_58);
        _Var4._M_pi = extraout_RDX_03;
        if (local_58.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_58.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
          _Var4._M_pi = extraout_RDX_04;
        }
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        _Var4._M_pi = extraout_RDX_01;
      }
      lVar2 = local_80[1];
      lVar6 = local_60;
    } while (*local_80 != lVar2);
  }
  ((Convertor *)&local_48->_vptr_Buffer)->_vptr_Convertor = (_func_int **)local_78;
  ((__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> *)
  &(local_48->super_enable_shared_from_this<Buffer>)._M_weak_this)->_M_ptr = peStack_70;
  PVar9.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi;
  PVar9.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_48;
  return (PBuffer)PVar9.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

PBuffer
ConvertorXMI2MID::create_track(MidiNodes *nodes) {
  class CompareByTime {
   public:
    // Return true if first midi node should come before second.
    bool operator()(const MidiNode &m1, const MidiNode &m2) const {
      if (m1.time != m2.time) {
        return m1.time > m2.time;
      }
      return false;
    }
  };

  // Sort the nodes.
  std::sort(nodes->begin(), nodes->end(), CompareByTime());

  PMutableBuffer data = std::make_shared<MutableBuffer>(Buffer::EndianessBig);
  uint64_t time = 0;
  while (!nodes->empty()) {
    MidiNode node = nodes->back();
    nodes->pop_back();

    midi_write_variable_size(node.time - time, data);
    time = node.time;
    data->push<uint8_t>(node.type);
    data->push<uint8_t>(node.data1);
    if (((node.type & 0xF0) != 0xC0) && ((node.type & 0xF0) != 0xD0)) {
      data->push<uint8_t>(node.data2);
      if (node.type == 0xFF) {
        if (node.data2 > 0) {
          data->push(node.buffer);
        }
      }
    }
  }

  return data;
}